

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pairing_lcl.h
# Opt level: O2

void fp2_square(fp2_struct_st *rop,fp2_struct_st *op,ATE_CTX *ctx)

{
  fp_struct_st *op2;
  fp_struct_st *p;
  fp_struct_st *rop_00;
  fp_t tmp2;
  fp_t tmp1;
  fp_t tmp3;
  fp_struct_st fStack_98;
  fp_struct_st local_78;
  undefined1 local_58 [40];
  
  op2 = op->m_b;
  p = ctx->p;
  fp_mul(&local_78,op->m_a,op2,p,ctx->n0);
  fp_add(&fStack_98,op,op2,p);
  fp_double(local_58,op,p);
  rop_00 = rop->m_b;
  fp_sub(rop_00,op2,local_58,p);
  fp_mul(rop_00,rop_00,&fStack_98,p,ctx->n0);
  fp_sub(rop_00,rop_00,&local_78,p);
  fp_double(&fStack_98,&local_78,p);
  fp_add(rop_00,rop_00,&fStack_98,p);
  fp_double(rop,&local_78,p);
  return;
}

Assistant:

static gml_inline void fp2_square(fp2_t rop, const fp2_t op, const ATE_CTX *ctx)
{
    fp_t tmp1, tmp2, tmp3; // Needed for intermediary results
// static int nnn2=0;
// nnn2++;
// printf("%d\n",nnn2);
    fp_mul(tmp1, op->m_a, op->m_b, ctx->p, ctx->n0);

    fp_add(tmp2, op->m_a, op->m_b, ctx->p);
// #if(ALPHA == 2)
//     fp_double(tmp3, op->m_a, ctx->p);
//     fp_add(rop->m_b, op->m_b, tmp3, ctx->p);
// #elif(ALPHA == -2)
    fp_double(tmp3, op->m_a, ctx->p);
	// fp_print(op->m_b, ctx);
	// fp_print(tmp3, ctx);
    // printf("%lx,\n",ctx->p->d[0]);
    // printf("%lx,\n",ctx->p->d[1]);
    // printf("%lx,\n",ctx->p->d[2]);
    // printf("%lx,\n",ctx->p->d[3]);
    fp_sub(rop->m_b, op->m_b, tmp3, ctx->p);
	// fp_print(rop->m_b, ctx);
// #elif(ALPHA == -1)
//     fp_sub(rop->m_b, op->m_b, op->m_a, ctx->p);
// #else
// #error "ALPHA must be -1, 2 or -2"
// #endif
    fp_mul(rop->m_b, rop->m_b, tmp2, ctx->p, ctx->n0);

    fp_sub(rop->m_b, rop->m_b, tmp1, ctx->p);
// #if(ALPHA == 2)
//     fp_double(tmp2, tmp1, ctx->p);
//     fp_sub(rop->m_b, rop->m_b, tmp2, ctx->p);
// #elif(ALPHA == -2)
    fp_double(tmp2, tmp1, ctx->p);
    fp_add(rop->m_b, rop->m_b, tmp2, ctx->p);
// #elif(ALPHA == -1)
//     fp_add(rop->m_b, rop->m_b, tmp1, ctx->p);
// #else
// #error "ALPHA must be -1, 2 or -2"
// #endif

    fp_double(rop->m_a, tmp1, ctx->p);
}